

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_assign_icc(LodePNGInfo *info,char *name,uchar *profile,uint profile_size)

{
  uint uVar1;
  char *pcVar2;
  uchar *__dest;
  
  pcVar2 = alloc_string(name);
  info->iccp_name = pcVar2;
  __dest = (uchar *)malloc((ulong)profile_size);
  info->iccp_profile = __dest;
  if (__dest == (uchar *)0x0 || pcVar2 == (char *)0x0) {
    uVar1 = 0x53;
  }
  else {
    memcpy(__dest,profile,(ulong)profile_size);
    info->iccp_profile_size = profile_size;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned lodepng_assign_icc(LodePNGInfo* info, const char* name, const unsigned char* profile, unsigned profile_size)
{
  info->iccp_name = alloc_string(name);
  info->iccp_profile = (unsigned char*)lodepng_malloc(profile_size);

  if(!info->iccp_name || !info->iccp_profile) return 83; /*alloc fail*/

  memcpy(info->iccp_profile, profile, profile_size);
  info->iccp_profile_size = profile_size;

  return 0; /*ok*/
}